

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorScriptReference::DescriptorScriptReference
          (DescriptorScriptReference *this,Script *locking_script,DescriptorScriptType script_type,
          DescriptorScriptReference *child_script,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *address_prefixes)

{
  undefined1 local_50 [40];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *address_prefixes_local;
  DescriptorScriptReference *child_script_local;
  pointer pSStack_18;
  DescriptorScriptType script_type_local;
  Script *locking_script_local;
  DescriptorScriptReference *this_local;
  
  this->script_type_ = script_type;
  local_50._32_8_ = address_prefixes;
  address_prefixes_local =
       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
       child_script;
  child_script_local._4_4_ = script_type;
  pSStack_18 = (pointer)locking_script;
  locking_script_local = (Script *)this;
  Script::Script(&this->locking_script_,locking_script);
  this->is_script_ = true;
  Script::Script(&this->redeem_script_);
  core::Address::Address(&this->address_script_);
  TapBranch::TapBranch(&this->tapbranch_);
  this->is_tapbranch_ = false;
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  ::std::shared_ptr<cfd::core::DescriptorScriptReference>::shared_ptr
            (&this->child_script_,(nullptr_t)0x0);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  vector(&this->keys_);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            (&this->addr_prefixes_,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_50._32_8_);
  Script::operator=(&this->redeem_script_,
                    (Script *)
                    &(address_prefixes_local->
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  ::std::
  make_shared<cfd::core::DescriptorScriptReference,cfd::core::DescriptorScriptReference_const&>
            ((DescriptorScriptReference *)local_50);
  ::std::shared_ptr<cfd::core::DescriptorScriptReference>::operator=
            (&this->child_script_,(shared_ptr<cfd::core::DescriptorScriptReference> *)local_50);
  ::std::shared_ptr<cfd::core::DescriptorScriptReference>::~shared_ptr
            ((shared_ptr<cfd::core::DescriptorScriptReference> *)local_50);
  return;
}

Assistant:

DescriptorScriptReference::DescriptorScriptReference(
    const Script& locking_script, DescriptorScriptType script_type,
    const DescriptorScriptReference& child_script,
    const std::vector<AddressFormatData>& address_prefixes)
    : script_type_(script_type),
      locking_script_(locking_script),
      is_script_(true),
      is_tapbranch_(false),
      addr_prefixes_(address_prefixes) {
  redeem_script_ = child_script.locking_script_;
  child_script_ = std::make_shared<DescriptorScriptReference>(child_script);
}